

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_http_req_handler.c
# Opt level: O2

_Bool uo_http_req_handler_try
                (uo_http_req_handler *http_req_handler,char *method_sp_uri,uo_strhashtbl *params,
                uo_refstack *refstack)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  char *key;
  long lVar4;
  uo_strhashtbl *hashtbl;
  char *pcVar5;
  size_t sVar6;
  uo_http_req_handler *puVar7;
  void **__ptr;
  undefined8 *puVar8;
  long *plVar9;
  char *pcVar10;
  char *p;
  size_t sVar11;
  bool bVar12;
  _Bool _Var13;
  undefined8 uStack_60;
  uo_strhashtbl *local_58;
  long local_50;
  uo_refstack *local_48;
  uo_http_req_handler *local_40;
  undefined1 *local_38;
  
  local_38 = (undefined1 *)&local_58;
  pcVar10 = http_req_handler->req_pattern;
  sVar11 = http_req_handler->param_count;
  local_58 = params;
  if (sVar11 == 0) {
    uStack_60 = 0x10539c;
    pcVar10 = uo_strdiff(pcVar10,method_sp_uri);
    if (pcVar10 == (char *)0x0) {
      _Var13 = true;
    }
    else {
      _Var13 = *pcVar10 == '*';
    }
  }
  else {
    lVar4 = -(sVar11 * 0x18 + 0xf & 0xfffffffffffffff0);
    local_50 = (long)&local_58 + lVar4;
    puVar8 = (undefined8 *)(sVar11 * 0x18 + local_50 + -8);
    local_48 = refstack;
    local_40 = http_req_handler;
    while( true ) {
      *(undefined8 *)((long)&uStack_60 + lVar4) = 0x105335;
      pcVar5 = uo_strdiff(pcVar10,method_sp_uri);
      bVar12 = sVar11 == 0;
      sVar11 = sVar11 - 1;
      if (bVar12) break;
      if (*pcVar5 != '{') goto LAB_00105471;
      puVar8[-2] = pcVar5 + 1;
      puVar8[-1] = method_sp_uri + ((long)pcVar5 - (long)pcVar10);
      *(undefined8 *)((long)&uStack_60 + lVar4) = 0x105365;
      sVar6 = strlen(pcVar5);
      cVar1 = pcVar5[sVar6 + 1];
      *(undefined8 *)((long)&uStack_60 + lVar4) = 0x105376;
      method_sp_uri = strchr(method_sp_uri + ((long)pcVar5 - (long)pcVar10),(int)cVar1);
      if (method_sp_uri == (char *)0x0) goto LAB_00105471;
      pcVar10 = pcVar5 + sVar6 + 1;
      *puVar8 = method_sp_uri;
      puVar8 = puVar8 + -3;
    }
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '*')) {
      sVar11 = local_40->param_count;
      pcVar10 = *(char **)(local_50 + -0x10 + sVar11 * 0x18);
      *(undefined8 *)((long)&uStack_60 + lVar4) = 0x1053dc;
      pcVar5 = strdup(pcVar10);
      *(undefined8 *)((long)&uStack_60 + lVar4) = 0x1053ee;
      puVar7 = (uo_http_req_handler *)uo_refcount_create(pcVar5,free);
      __ptr = local_48->items;
      sVar2 = local_48->count;
      local_48->count = sVar2 + 1;
      if (sVar2 == local_48->capacity) {
        local_48->capacity = sVar2 * 2;
        local_40 = puVar7;
        *(undefined8 *)((long)&uStack_60 + lVar4) = 0x105425;
        __ptr = (void **)realloc(__ptr,sVar2 << 4);
        local_48->items = __ptr;
        puVar7 = local_40;
      }
      __ptr[sVar2] = puVar7;
      plVar9 = (long *)(sVar11 * 0x18 + local_50 + -8);
      while (hashtbl = local_58, bVar12 = sVar11 != 0, sVar11 = sVar11 - 1, bVar12) {
        lVar3 = plVar9[-1];
        pcVar5[*plVar9 - (long)pcVar10] = '\0';
        key = (char *)plVar9[-2];
        *(undefined8 *)((long)&uStack_60 + lVar4) = 0x10546b;
        uo_strhashtbl_set(hashtbl,key,pcVar5 + (lVar3 - (long)pcVar10));
        plVar9 = plVar9 + -3;
      }
      _Var13 = true;
    }
    else {
LAB_00105471:
      _Var13 = false;
    }
  }
  return _Var13;
}

Assistant:

bool uo_http_req_handler_try(
    uo_http_req_handler *http_req_handler,
    const char *method_sp_uri,
    uo_strhashtbl *params,
    uo_refstack *refstack)
{
    char *req_pattern = http_req_handler->req_pattern;
    size_t i = http_req_handler->param_count;

    if (i == 0)
    {
        // request line is checked for exact match or prefix match
        char *p = uo_strdiff(req_pattern, method_sp_uri);
        return !p || *p == '*';
    }

    // temporary array for pattern parameter name start, value start and value end pointers
    char *param_ptrs[i * 3];

    while (i--)
    {
        // find pattern parameter
        char *param_start = uo_strdiff(req_pattern, method_sp_uri);

        if (*param_start != '{')
            return false;

        // store pattern parameter name pointer
        param_ptrs[i * 3] = param_start + 1;

        // store matched pattern parameter value start pointer
        param_ptrs[i * 3 + 1] = (char *)(method_sp_uri += param_start - req_pattern);

        // skip pattern parameter name
        req_pattern = param_start + strlen(param_start) + 1;

        // find pattern parameter value end
        method_sp_uri = strchr(method_sp_uri, *req_pattern);

        if (!method_sp_uri)
            return false;

        // store matched pattern parameter end pointer
        param_ptrs[i * 3 + 2] = (char *)method_sp_uri;
    }

    {
        // chech if the request line end either a exact match or a prefix match
        char *p = uo_strdiff(req_pattern, method_sp_uri);
        if (p && *p != '*')
            return false;
    }

    // req_handler matches the request method and URI
    // now store the pattern parameters

    i = http_req_handler->param_count;
    char *first_param_value = param_ptrs[(i - 1) * 3 + 1];
    char *param_value_buf = strdup(first_param_value);
    uo_refstack_push(refstack, param_value_buf, free);

    while (i--)
    {
        // null terminate parameter value
        char *param_value = param_value_buf + (param_ptrs[i * 3 + 1] - first_param_value);
        param_value_buf[param_ptrs[i * 3 + 2] - first_param_value] = '\0';

        // get parameter name
        char *param_name = param_ptrs[i * 3];

        // store parameter name and value
        uo_strhashtbl_set(params, param_name, param_value);
    }

    return true;
}